

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldLiteGenerator::
GenerateSerializationCode(ImmutableLazyMessageOneofFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_ImmutableLazyMessageFieldLiteGenerator).
                              super_ImmutableMessageFieldLiteGenerator.variables_,
                     "if ($has_oneof_case_message$) {\n  output.writeBytes(\n      $number$, (($lazy_type$) $oneof_name$_).toByteString());\n}\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldLiteGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  // Do not de-serialize lazy fields.
  printer->Print(variables_,
    "if ($has_oneof_case_message$) {\n"
    "  output.writeBytes(\n"
    "      $number$, (($lazy_type$) $oneof_name$_).toByteString());\n"
    "}\n");
}